

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeval.c
# Opt level: O3

timediff_t curlx_timediff_us(curltime newer,curltime older)

{
  timediff_t tVar1;
  long lVar2;
  
  tVar1 = 0x7fffffffffffffff;
  lVar2 = newer.tv_sec - older.tv_sec;
  if (lVar2 < 0x8637bd05af6) {
    if (lVar2 < -0x8637bd05af5) {
      return -0x8000000000000000;
    }
    tVar1 = ((long)newer.tv_usec + lVar2 * 1000000) - (long)older.tv_usec;
  }
  return tVar1;
}

Assistant:

timediff_t Curl_timediff_us(struct curltime newer, struct curltime older)
{
  timediff_t diff = (timediff_t)newer.tv_sec-older.tv_sec;
  if(diff >= (TIMEDIFF_T_MAX/1000000))
    return TIMEDIFF_T_MAX;
  else if(diff <= (TIMEDIFF_T_MIN/1000000))
    return TIMEDIFF_T_MIN;
  return diff * 1000000 + newer.tv_usec-older.tv_usec;
}